

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O3

void __thiscall
WordSplitOnceTest_random_view_Test<char32_t>::TestBody
          (WordSplitOnceTest_random_view_Test<char32_t> *this)

{
  char32_t in_R8D;
  char *pcVar1;
  pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
  split_result;
  RandomWordTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  data;
  AssertHelper local_e0 [8];
  Message local_d8;
  undefined7 uStack_d7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_b8;
  pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
  local_a8;
  RandomWordTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_88;
  
  RandomWordTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::RandomWordTestData(&local_88,L'\0',0,0);
  jessilib::
  word_split_once<std::basic_string_view<char32_t,std::char_traits<char32_t>>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,char32_t>
            (&local_a8,(jessilib *)local_88.m_str._M_dataplus._M_p,
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )(local_88.m_str._M_dataplus._M_p + local_88.m_str._M_string_length),
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )0x0,in_R8D);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char32_t,std::char_traits<char32_t>>,std::__cxx11::u32string>
            ((internal *)local_c8,"split_result.first","data.m_tokens[0]",&local_a8.first,
             local_88.m_tokens.
             super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message(&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x99,pcVar1);
    testing::internal::AssertHelper::operator=(local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((long *)CONCAT71(uStack_d7,local_d8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_d7,local_d8) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  RandomWordTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::get_remainder((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                  local_c8,&local_88,1);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char32_t,std::char_traits<char32_t>>,std::__cxx11::u32string>
            ((internal *)&local_d8,"split_result.second","data.get_remainder(1)",&local_a8.second,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                     *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity * 4 + 4);
  }
  if (local_d8 == (Message)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x9a,pcVar1);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((long *)CONCAT71(local_c8._1_7_,local_c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c8._1_7_,local_c8[0]) + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  if (local_88.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.m_token_indexes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~vector(&local_88.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_88.m_str._M_dataplus._M_p != &local_88.m_str.field_2) {
    operator_delete(local_88.m_str._M_dataplus._M_p,
                    local_88.m_str.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_88.m_delim._M_dataplus._M_p != &local_88.m_delim.field_2) {
    operator_delete(local_88.m_delim._M_dataplus._M_p,
                    local_88.m_delim.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitOnceTest, random_view) {
	RandomWordTestData<TypeParam> data{};
	std::pair<std::basic_string_view<TypeParam>, std::basic_string_view<TypeParam>> split_result = word_split_once_view(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}